

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O3

int run_test_random_async(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  long lVar4;
  char *extraout_RDX;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  uv_random_t req;
  undefined1 auStack_3e8 [16];
  uv_loop_t *apuStack_3d8 [32];
  undefined1 auStack_2d8 [256];
  code *pcStack_1d8;
  long lStack_1d0;
  long lStack_1c8;
  undefined1 auStack_1c0 [256];
  uv_loop_t *puStack_c0;
  long local_a8;
  long local_a0;
  uv_random_t local_98;
  
  puVar3 = uv_default_loop();
  local_a0 = -0x16;
  lVar4 = 0x100;
  iVar1 = uv_random(puVar3,&local_98,scratch,0x100,0xffffffff,random_cb);
  local_a8 = (long)iVar1;
  if (local_a0 == local_a8) {
    local_a0 = -7;
    lVar4 = -1;
    iVar1 = uv_random(puVar3,&local_98,scratch,0xffffffffffffffff,0xffffffff,random_cb);
    local_a8 = (long)iVar1;
    if (local_a0 != local_a8) goto LAB_001b489b;
    lVar4 = 0;
    iVar1 = uv_random(puVar3,&local_98,scratch,0,0,random_cb);
    local_a0 = (long)iVar1;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001b48a8;
    local_a0 = (long)random_cb_called;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001b48b5;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    local_a0 = (long)iVar1;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001b48c2;
    local_a0 = 1;
    local_a8 = (long)random_cb_called;
    if (local_a8 != 1) goto LAB_001b48cf;
    lVar4 = 0x100;
    iVar1 = uv_random(puVar3,&local_98,scratch,0x100,0,random_cb);
    local_a0 = (long)iVar1;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001b48dc;
    local_a0 = 1;
    local_a8 = (long)random_cb_called;
    if (local_a8 != 1) goto LAB_001b48e9;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    local_a0 = (long)iVar1;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001b48f6;
    local_a0 = 2;
    local_a8 = (long)random_cb_called;
    if (local_a8 != 2) goto LAB_001b4903;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_a0 = 0;
    iVar1 = uv_loop_close(puVar3);
    local_a8 = (long)iVar1;
    if (local_a0 == local_a8) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_random_async_cold_1();
LAB_001b489b:
    run_test_random_async_cold_2();
LAB_001b48a8:
    run_test_random_async_cold_3();
LAB_001b48b5:
    run_test_random_async_cold_4();
LAB_001b48c2:
    run_test_random_async_cold_5();
LAB_001b48cf:
    run_test_random_async_cold_6();
LAB_001b48dc:
    run_test_random_async_cold_7();
LAB_001b48e9:
    run_test_random_async_cold_8();
LAB_001b48f6:
    run_test_random_async_cold_9();
LAB_001b4903:
    run_test_random_async_cold_10();
  }
  iVar2 = (int)&local_a8;
  run_test_random_async_cold_11();
  pcStack_1d8 = (code *)0x1b4941;
  puStack_c0 = puVar3;
  memset(auStack_1c0,0,0x100);
  iVar1 = random_cb_called;
  lStack_1c8 = (long)iVar2;
  lStack_1d0 = 0;
  if (lStack_1c8 == 0) {
    if (extraout_RDX != scratch) goto LAB_001b4a3c;
    if (random_cb_called != 0) {
      lStack_1d0 = 0x100;
      lStack_1c8 = lVar4;
      if (lVar4 == 0x100) {
        lStack_1c8 = 0;
        pcStack_1d8 = (code *)0x1b49b5;
        iVar2 = memcmp(scratch,auStack_1c0,0x100);
        lStack_1d0 = (long)iVar2;
        if (lStack_1c8 != lStack_1d0) goto LAB_001b4a1b;
        pcStack_1d8 = (code *)0x1b49d3;
        random_cb_cold_4();
        goto LAB_001b49d3;
      }
      goto LAB_001b4a44;
    }
LAB_001b49d3:
    lStack_1d0 = 0;
    lStack_1c8 = lVar4;
    if (lVar4 != 0) goto LAB_001b4a51;
    pcStack_1d8 = (code *)0x1b4a01;
    iVar2 = memcmp(scratch,auStack_1c0,0x100);
    lStack_1c8 = (long)iVar2;
    lStack_1d0 = 0;
    if (lStack_1c8 == 0) {
LAB_001b4a1b:
      random_cb_called = iVar1 + 1;
      return (int)lStack_1c8;
    }
  }
  else {
    pcStack_1d8 = (code *)0x1b4a3c;
    random_cb_cold_1();
LAB_001b4a3c:
    pcStack_1d8 = (code *)0x1b4a44;
    random_cb_cold_2();
LAB_001b4a44:
    pcStack_1d8 = (code *)0x1b4a51;
    random_cb_cold_3();
LAB_001b4a51:
    pcStack_1d8 = (code *)0x1b4a5e;
    random_cb_cold_5();
  }
  pcStack_1d8 = run_test_random_sync;
  random_cb_cold_6();
  handle = (uv_handle_t *)auStack_3e8;
  apuStack_3d8[0] = (uv_loop_t *)0xffffffffffffffea;
  pcStack_1d8 = (code *)lVar4;
  iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,auStack_2d8,0x100,0xffffffff,
                    (uv_random_cb)0x0);
  auStack_3e8._0_8_ = SEXT48(iVar1);
  if (apuStack_3d8[0] == (uv_loop_t *)auStack_3e8._0_8_) {
    apuStack_3d8[0] = (uv_loop_t *)0xfffffffffffffff9;
    iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,auStack_2d8,0xffffffffffffffff,0xffffffff,
                      (uv_random_cb)0x0);
    auStack_3e8._0_8_ = SEXT48(iVar1);
    if (apuStack_3d8[0] != (uv_loop_t *)auStack_3e8._0_8_) goto LAB_001b4be9;
    memset(auStack_2d8,0,0x100);
    iVar1 = uv_random((uv_loop_t *)0x0,(uv_random_t *)0x0,auStack_2d8,0x100,0,(uv_random_cb)0x0);
    apuStack_3d8[0] = (uv_loop_t *)(long)iVar1;
    auStack_3e8._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_3d8[0] != (uv_loop_t *)0x0) goto LAB_001b4bf6;
    memset(apuStack_3d8,0,0x100);
    auStack_3e8._0_8_ = (uv_loop_t *)0x0;
    iVar1 = memcmp(auStack_2d8,apuStack_3d8,0x100);
    auStack_3e8._8_8_ = SEXT48(iVar1);
    if (auStack_3e8._0_8_ != auStack_3e8._8_8_) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_3e8._0_8_ = (uv_loop_t *)0x0;
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      auStack_3e8._8_8_ = SEXT48(iVar1);
      if (auStack_3e8._0_8_ == auStack_3e8._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b4c10;
    }
  }
  else {
    run_test_random_sync_cold_1();
LAB_001b4be9:
    run_test_random_sync_cold_2();
LAB_001b4bf6:
    run_test_random_sync_cold_3();
  }
  run_test_random_sync_cold_5();
LAB_001b4c10:
  run_test_random_sync_cold_4();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(random_async) {
  uv_random_t req;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT_EQ(UV_EINVAL, uv_random(loop, &req, scratch, sizeof(scratch), -1,
                                 random_cb));
  ASSERT_EQ(UV_E2BIG, uv_random(loop, &req, scratch, -1, -1, random_cb));

  ASSERT_OK(uv_random(loop, &req, scratch, 0, 0, random_cb));
  ASSERT_OK(random_cb_called);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, random_cb_called);

  ASSERT_OK(uv_random(loop, &req, scratch, sizeof(scratch), 0, random_cb));
  ASSERT_EQ(1, random_cb_called);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(2, random_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}